

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O1

DecodeStatus DecodeT2LoadImm8(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint16_t *Decoder_01;
  uint64_t extraout_RDX;
  uint64_t extraout_RDX_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = Insn >> 0x10 & 0xf;
  if (uVar4 == 0xf) {
    uVar4 = MCInst_getOpcode(Inst);
    Decoder_00 = (void *)(ulong)uVar4;
    if ((int)uVar4 < 0x96d) {
      if (uVar4 == 0x94e) {
        uVar3 = 0x94f;
      }
      else if (uVar4 == 0x95d) {
        uVar3 = 0x95e;
      }
      else {
        if (uVar4 != 0x965) {
          return MCDisassembler_Fail;
        }
        uVar3 = 0x966;
      }
    }
    else if ((int)uVar4 < 0x9b8) {
      if (uVar4 == 0x96d) {
        uVar3 = 0x96e;
      }
      else {
        uVar3 = 0x976;
        if (uVar4 != 0x975) {
          return MCDisassembler_Fail;
        }
      }
    }
    else if (uVar4 == 0x9b8) {
      uVar3 = 0x9b9;
    }
    else {
      if (uVar4 != 0x9bc) {
        return MCDisassembler_Fail;
      }
      uVar3 = 0x9bd;
    }
    MCInst_setOpcode(Inst,uVar3);
    DVar2 = DecodeT2LoadLabel(Inst,Insn,Address_01,Decoder_00);
    return DVar2;
  }
  uVar5 = Insn >> 0xc & 0xf;
  uVar3 = Insn >> 9 & 1;
  if (uVar5 == 0xf) {
    uVar1 = MCInst_getOpcode(Inst);
    if (uVar1 == 0x96d) {
      return MCDisassembler_Fail;
    }
    if (uVar1 == 0x965) {
      uVar1 = 0x9bc;
    }
    else if ((uVar1 != 0x95d) || (uVar1 = 0x9b5, uVar3 != 0)) goto LAB_001e4297;
    MCInst_setOpcode(Inst,uVar1);
  }
LAB_001e4297:
  uVar1 = MCInst_getOpcode(Inst);
  if ((7 < uVar1 - 0x9b5) ||
     (Decoder_01 = (uint16_t *)0x89, Address_00 = extraout_RDX,
     (0x89U >> (uVar1 - 0x9b5 & 0x1f) & 1) == 0)) {
    Decoder_01 = GPRDecoderTable;
    MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar5]);
    Address_00 = extraout_RDX_00;
  }
  DVar2 = DecodeT2AddrModeImm8(Inst,uVar4 << 9 | uVar3 << 8 | Insn & 0xff,Address_00,Decoder_01);
  if (MCDisassembler_Success < DVar2) {
    return MCDisassembler_Fail;
  }
  return *(DecodeStatus *)(&DAT_00375200 + (ulong)DVar2 * 4);
}

Assistant:

static DecodeStatus DecodeT2LoadImm8(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void* Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned U = fieldFromInstruction_4(Insn, 9, 1);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 8);
	unsigned add = fieldFromInstruction_4(Insn, 9, 1);

	uint64_t featureBits = ARM_getFeatureBits(Inst->csh->mode);
	bool hasMP = ((featureBits & ARM_FeatureMP) != 0);
	bool hasV7Ops = ((featureBits & ARM_HasV7Ops) != 0);

	imm |= (U << 8);
	imm |= (Rn << 9);
	if (Rn == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRi8:
				MCInst_setOpcode(Inst, ARM_t2LDRpci);
				break;
			case ARM_t2LDRBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRBpci);
				break;
			case ARM_t2LDRSBi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSBpci);
				break;
			case ARM_t2LDRHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRHpci);
				break;
			case ARM_t2LDRSHi8:
				MCInst_setOpcode(Inst, ARM_t2LDRSHpci);
				break;
			case ARM_t2PLDi8:
				MCInst_setOpcode(Inst, ARM_t2PLDpci);
				break;
			case ARM_t2PLIi8:
				MCInst_setOpcode(Inst, ARM_t2PLIpci);
				break;
			default:
				return MCDisassembler_Fail;
		}
		return DecodeT2LoadLabel(Inst, Insn, Address, Decoder);
	}

	if (Rt == 15) {
		switch (MCInst_getOpcode(Inst)) {
			case ARM_t2LDRSHi8:
				return MCDisassembler_Fail;
			case ARM_t2LDRHi8:
				if (!add)
					MCInst_setOpcode(Inst, ARM_t2PLDWi8);
				break;
			case ARM_t2LDRSBi8:
				MCInst_setOpcode(Inst, ARM_t2PLIi8);
				break;
			default:
				break;
		}
	}

	switch (MCInst_getOpcode(Inst)) {
		case ARM_t2PLDi8:
			break;
		case ARM_t2PLIi8:
			if (!hasV7Ops)
				return MCDisassembler_Fail;
			break;
		case ARM_t2PLDWi8:
			if (!hasV7Ops || !hasMP)
				return MCDisassembler_Fail;
			break;
		default:
			if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
				return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeT2AddrModeImm8(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	return S;
}